

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  ParseError *e;
  string local_f8;
  allocator<char> local_c1;
  string local_c0;
  Parser local_99;
  undefined1 local_98 [8];
  Balk balk;
  char **argv_local;
  int argc_local;
  
  balk.b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)argv;
  if (argc == 3) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,pcVar1,&local_c1);
    Parser::get_balk_from_file((Balk *)local_98,&local_99,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    Balk::solve_balk((Balk *)local_98);
    pcVar1 = (char *)balk.b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,pcVar1,(allocator<char> *)((long)&e + 7));
    Balk::save_result((Balk *)local_98,&local_f8,1000);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
    Balk::~Balk((Balk *)local_98);
    argv_local._4_4_ = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar2 = std::operator<<(poVar2,(char *)*balk.b.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar2 = std::operator<<(poVar2," \"<input_file_name>\" \"<output_folder_name>\"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    if (argc != 3) {
        std::cout << "Usage: " << argv[0] <<" \"<input_file_name>\" \"<output_folder_name>\"" << std::endl;
        return -1;
    }
    try
    {
        Balk balk = Parser().get_balk_from_file(argv[1]);
        balk.solve_balk();
        balk.save_result(argv[2]);
    }
    catch (const ParseError &e)
    {
        std::cout << e.what() << std::endl;
        return -1;
    }
    return 0;
}